

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O1

int testValidDeConvolution3D(void)

{
  RepeatedField<long> *this;
  pointer pcVar1;
  GRULayerParams *pGVar2;
  bool bVar3;
  ModelDescription *pMVar4;
  Type *pTVar5;
  FeatureType *pFVar6;
  ArrayFeatureType *pAVar7;
  TypeUnion this_00;
  Type *this_01;
  Convolution3DLayerParams *this_02;
  WeightParams *pWVar8;
  ostream *poVar9;
  int iVar10;
  int iVar11;
  Result res;
  Model m1;
  undefined1 local_78 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  Model local_50;
  
  CoreML::Specification::Model::Model(&local_50);
  if (local_50.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    local_50.description_ = pMVar4;
  }
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_50.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pcVar1 = local_78 + 0x10;
  local_78._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"input","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar5->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_78);
  if ((pointer)local_78._0_8_ != pcVar1) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  if (pTVar5->type_ == (FeatureType *)0x0) {
    pFVar6 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar6);
    pTVar5->type_ = pFVar6;
  }
  pFVar6 = pTVar5->type_;
  if (pFVar6->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    pAVar7 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar7);
    (pFVar6->Type_).multiarraytype_ = pAVar7;
  }
  pAVar7 = (pFVar6->Type_).multiarraytype_;
  this = &pAVar7->shape_;
  iVar11 = (pAVar7->shape_).total_size_;
  if ((pAVar7->shape_).current_size_ == iVar11) {
    google::protobuf::RepeatedField<long>::Reserve(this,iVar11 + 1);
  }
  iVar11 = (pAVar7->shape_).current_size_;
  iVar10 = iVar11 + 1;
  (pAVar7->shape_).current_size_ = iVar10;
  ((pAVar7->shape_).rep_)->elements[iVar11] = 1;
  iVar11 = (pAVar7->shape_).total_size_;
  if (iVar10 == iVar11) {
    google::protobuf::RepeatedField<long>::Reserve(this,iVar11 + 1);
  }
  iVar11 = (pAVar7->shape_).current_size_;
  iVar10 = iVar11 + 1;
  (pAVar7->shape_).current_size_ = iVar10;
  ((pAVar7->shape_).rep_)->elements[iVar11] = 3;
  iVar11 = (pAVar7->shape_).total_size_;
  if (iVar10 == iVar11) {
    google::protobuf::RepeatedField<long>::Reserve(this,iVar11 + 1);
  }
  iVar11 = (pAVar7->shape_).current_size_;
  iVar10 = iVar11 + 1;
  (pAVar7->shape_).current_size_ = iVar10;
  ((pAVar7->shape_).rep_)->elements[iVar11] = 0x20;
  iVar11 = (pAVar7->shape_).total_size_;
  if (iVar10 == iVar11) {
    google::protobuf::RepeatedField<long>::Reserve(this,iVar11 + 1);
  }
  iVar11 = (pAVar7->shape_).current_size_;
  iVar10 = iVar11 + 1;
  (pAVar7->shape_).current_size_ = iVar10;
  ((pAVar7->shape_).rep_)->elements[iVar11] = 100;
  iVar11 = (pAVar7->shape_).total_size_;
  if (iVar10 == iVar11) {
    google::protobuf::RepeatedField<long>::Reserve(this,iVar11 + 1);
  }
  iVar11 = (pAVar7->shape_).current_size_;
  (pAVar7->shape_).current_size_ = iVar11 + 1;
  ((pAVar7->shape_).rep_)->elements[iVar11] = 100;
  if (local_50.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    local_50.description_ = pMVar4;
  }
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_50.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_78._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"probs","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar5->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_78);
  if ((pointer)local_78._0_8_ != pcVar1) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  if (pTVar5->type_ == (FeatureType *)0x0) {
    pFVar6 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar6);
    pTVar5->type_ = pFVar6;
  }
  pFVar6 = pTVar5->type_;
  if (pFVar6->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    pAVar7 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar7);
    (pFVar6->Type_).multiarraytype_ = pAVar7;
  }
  if (local_50._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_50);
    local_50._oneof_case_[0] = 500;
    this_00.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(this_00.neuralnetwork_);
    local_50.Type_.pipelineclassifier_ = this_00.pipelineclassifier_;
  }
  (local_50.Type_.neuralnetworkregressor_)->arrayinputshapemapping_ = 1;
  this_01 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)&(local_50.Type_.pipeline_)->models_,(Type *)0x0);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_01,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_01,"probs");
  if (this_01->_oneof_case_[0] != 0x5bf) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this_01);
    this_01->_oneof_case_[0] = 0x5bf;
    this_02 = (Convolution3DLayerParams *)operator_new(0x90);
    CoreML::Specification::Convolution3DLayerParams::Convolution3DLayerParams(this_02);
    (this_01->layer_).convolution3d_ = this_02;
  }
  pGVar2 = (this_01->layer_).gru_;
  *(undefined8 *)((long)&pGVar2->outputgateweightmatrix_ + 4) = 0x100000003;
  *(undefined4 *)&pGVar2->outputgateweightmatrix_ = 3;
  *(undefined8 *)((long)&pGVar2->updategaterecursionmatrix_ + 4) = 0x300000003;
  *(undefined4 *)((long)&pGVar2->resetgaterecursionmatrix_ + 4) = 3;
  pGVar2->outputgaterecursionmatrix_ = (WeightParams *)0x100000001;
  pGVar2->updategatebiasvector_ = (WeightParams *)0x100000001;
  pGVar2->resetgatebiasvector_ = (WeightParams *)0x100000001;
  *(undefined8 *)((long)&pGVar2->outputgatebiasvector_ + 4) = 0;
  *(undefined8 *)((long)&pGVar2->inputvectorsize_ + 4) = 0;
  pGVar2->outputvectorsize_ = 0;
  pGVar2->sequenceoutput_ = false;
  pGVar2->hasbiasvectors_ = false;
  pGVar2->reverseinput_ = false;
  pGVar2->field_0x83 = 0;
  pGVar2->_cached_size_ = 0;
  *(undefined2 *)&pGVar2->outputgatebiasvector_ = 0x101;
  iVar11 = 0xf3;
  do {
    if (pGVar2->updategateweightmatrix_ == (WeightParams *)0x0) {
      pWVar8 = (WeightParams *)operator_new(0x50);
      CoreML::Specification::WeightParams::WeightParams(pWVar8);
      pGVar2->updategateweightmatrix_ = pWVar8;
    }
    pWVar8 = pGVar2->updategateweightmatrix_;
    iVar10 = (pWVar8->floatvalue_).total_size_;
    if ((pWVar8->floatvalue_).current_size_ == iVar10) {
      google::protobuf::RepeatedField<float>::Reserve(&pWVar8->floatvalue_,iVar10 + 1);
    }
    iVar10 = (pWVar8->floatvalue_).current_size_;
    (pWVar8->floatvalue_).current_size_ = iVar10 + 1;
    ((pWVar8->floatvalue_).rep_)->elements[iVar10] = 1.0;
    iVar11 = iVar11 + -1;
  } while (iVar11 != 0);
  iVar11 = 3;
  do {
    if (pGVar2->resetgateweightmatrix_ == (WeightParams *)0x0) {
      pWVar8 = (WeightParams *)operator_new(0x50);
      CoreML::Specification::WeightParams::WeightParams(pWVar8);
      pGVar2->resetgateweightmatrix_ = pWVar8;
    }
    pWVar8 = pGVar2->resetgateweightmatrix_;
    iVar10 = (pWVar8->floatvalue_).total_size_;
    if ((pWVar8->floatvalue_).current_size_ == iVar10) {
      google::protobuf::RepeatedField<float>::Reserve(&pWVar8->floatvalue_,iVar10 + 1);
    }
    iVar10 = (pWVar8->floatvalue_).current_size_;
    (pWVar8->floatvalue_).current_size_ = iVar10 + 1;
    ((pWVar8->floatvalue_).rep_)->elements[iVar10] = 1.0;
    iVar11 = iVar11 + -1;
  } while (iVar11 != 0);
  CoreML::validate<(MLModelType)500>((Result *)local_78,&local_50);
  bVar3 = CoreML::Result::good((Result *)local_78);
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xa96);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"(res).good()",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._8_8_ != &local_60) {
    operator_delete((void *)local_78._8_8_,local_60._0_8_ + 1);
  }
  CoreML::Specification::Model::~Model(&local_50);
  return (uint)!bVar3;
}

Assistant:

int testValidDeConvolution3D() {
    Specification::Model m1;

    int input_channels = 3;
    int output_channels = 3;
    int kernel_depth = 3;
    int kernel_height = 3;
    int kernel_width = 3;
    int nGroups = 1;
    int stride_depth = 1;
    int stride_height = 1;
    int stride_width = 1;
    int dilation_depth = 1;
    int dilation_height = 1;
    int dilation_width = 1;
    int pad_front = 0;
    int pad_back = 0;
    int pad_top = 0;
    int pad_bottom = 0;
    int pad_left = 0;
    int pad_right = 0;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);
    shape->add_shape(3);
    shape->add_shape(32);
    shape->add_shape(100);
    shape->add_shape(100);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    Specification::NeuralNetworkLayer *convLayer = nn->add_layers();
    convLayer->add_input("input");
    convLayer->add_output("probs");
    auto *params = convLayer->mutable_convolution3d();
    params->set_inputchannels(input_channels);
    params->set_outputchannels(output_channels);
    params->set_kerneldepth(kernel_depth);
    params->set_kernelheight(kernel_height);
    params->set_kernelwidth(kernel_width);
    params->set_ngroups(nGroups);
    params->set_stridedepth(stride_depth);
    params->set_strideheight(stride_height);
    params->set_stridewidth(stride_width);
    params->set_dilationdepth(dilation_depth);
    params->set_dilationheight(dilation_height);
    params->set_dilationwidth(dilation_width);
    params->set_paddingtype(CoreML::Specification::Convolution3DLayerParams_PaddingType_CUSTOM);
    params->set_custompaddingfront(pad_front);
    params->set_custompaddingback(pad_back);
    params->set_custompaddingtop(pad_top);
    params->set_custompaddingbottom(pad_bottom);
    params->set_custompaddingleft(pad_left);
    params->set_custompaddingright(pad_right);
    params->set_isdeconvolution(true);
    params->set_hasbias(true);

    // Fill weights
    for (int i = 0; i < output_channels * (input_channels / nGroups) * kernel_depth * kernel_height * kernel_width; i++) {
        params->mutable_weights()->add_floatvalue(1.0);
    }

    // Fill bias
    for (int i = 0; i < output_channels; i++) {
        params->mutable_bias()->add_floatvalue(1.0);
    }

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_GOOD(res);
    return 0;
}